

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  Slice *in_RDX;
  uint32_t *puVar5;
  ulong uVar6;
  int level;
  long lVar7;
  string record;
  VersionEdit edit;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type sStack_e0;
  VersionEdit local_d8;
  
  local_d8.comparator_._M_dataplus._M_p = (pointer)&local_d8.comparator_.field_2;
  lVar7 = 0;
  local_d8.comparator_._M_string_length = 0;
  local_d8.comparator_.field_2._M_local_buf[0] = '\0';
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  VersionEdit::Clear(&local_d8);
  iVar3 = (*(log[2].dest_)->_vptr_WritableFile[3])();
  local_108._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
  local_108._M_string_length = strlen(local_108._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d8,(Slice *)&local_108);
  paVar1 = &local_108.field_2;
  puVar5 = log[0xb].type_crc_ + 3;
  do {
    if (*(long *)puVar5 != 0) {
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_108._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,*(ulong *)(puVar5 + -2));
      VersionEdit::SetCompactPointer(&local_d8,(int)lVar7,(InternalKey *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    lVar7 = lVar7 + 1;
    puVar5 = puVar5 + 8;
  } while (lVar7 != 7);
  lVar7 = 0;
  do {
    lVar2 = *(long *)&log[0xb].block_offset_;
    lVar4 = *(long *)(lVar2 + 0x20 + lVar7 * 0x18);
    if (*(long *)(lVar2 + 0x28 + lVar7 * 0x18) != lVar4) {
      lVar2 = lVar2 + lVar7 * 0x18;
      uVar6 = 0;
      do {
        lVar4 = *(long *)(lVar4 + uVar6 * 8);
        VersionEdit::AddFile
                  (&local_d8,(int)lVar7,*(uint64_t *)(lVar4 + 8),*(uint64_t *)(lVar4 + 0x10),
                   (InternalKey *)(lVar4 + 0x18),(InternalKey *)(lVar4 + 0x38));
        uVar6 = uVar6 + 1;
        lVar4 = *(long *)(lVar2 + 0x20);
      } while (uVar6 < (ulong)(*(long *)(lVar2 + 0x28) - lVar4 >> 3));
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)paVar1;
  VersionEdit::EncodeTo(&local_d8,&local_108);
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_108._M_dataplus._M_p;
  sStack_e0 = local_108._M_string_length;
  leveldb::log::Writer::AddRecord((Writer *)this,in_RDX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}